

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O2

void __thiscall libDAI::IJGP::updateMessage(IJGP *this,size_t e)

{
  double dVar1;
  size_t i1;
  size_t i2;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Factor *pFVar3;
  undefined4 extraout_var_06;
  size_t *psVar4;
  size_t *psVar5;
  Factor newmessage;
  Factor prod;
  TFactor<double> local_d8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  i1 = *(size_t *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x110) + e * 0x10);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  i2 = *(size_t *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x110) + 8 + e * 0x10);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  TFactor<double>::TFactor
            (&prod,(TFactor<double> *)
                   (i1 * 0x40 + *(long *)(CONCAT44(extraout_var_01,iVar2) + 0xe0)));
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  psVar4 = *(size_t **)(*(long *)(CONCAT44(extraout_var_02,iVar2) + 0x140) + i1 * 0x18);
  while( true ) {
    iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if (psVar4 == *(size_t **)(*(long *)(CONCAT44(extraout_var_03,iVar2) + 0x140) + 8 + i1 * 0x18))
    break;
    if (*psVar4 != i2) {
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      psVar5 = *(size_t **)(*(long *)(CONCAT44(extraout_var_04,iVar2) + 0x158) + *psVar4 * 0x18);
      while( true ) {
        iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (psVar5 == *(size_t **)
                       (*(long *)(CONCAT44(extraout_var_05,iVar2) + 0x158) + 8 + *psVar4 * 0x18))
        break;
        if (*psVar5 != i1) {
          pFVar3 = message(this,*psVar5,*psVar4);
          TFactor<double>::operator*=(&prod,pFVar3);
        }
        psVar5 = psVar5 + 1;
      }
    }
    psVar4 = psVar4 + 1;
  }
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  TFactor<double>::marginal
            (&newmessage,&prod,
             (VarSet *)(i2 * 0x28 + *(long *)(CONCAT44(extraout_var_06,iVar2) + 0xf8)),true);
  dVar1 = (this->Props).damping;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    pFVar3 = message(this,i1,i2);
    TFactor<double>::operator^(&local_a0,pFVar3,(this->Props).damping);
    TFactor<double>::operator^(&local_d8,&newmessage,1.0 - (this->Props).damping);
    TFactor<double>::operator*(&local_68,&local_a0,&local_d8);
    pFVar3 = message(this,i1,i2);
    TFactor<double>::operator=(pFVar3,&local_68);
    TFactor<double>::~TFactor(&local_68);
    TFactor<double>::~TFactor(&local_d8);
    TFactor<double>::~TFactor(&local_a0);
  }
  else {
    pFVar3 = message(this,i1,i2);
    TFactor<double>::operator=(pFVar3,&newmessage);
  }
  TFactor<double>::~TFactor(&newmessage);
  TFactor<double>::~TFactor(&prod);
  return;
}

Assistant:

void IJGP::updateMessage(size_t e) {
        size_t alpha = grm().Redge(e).first;
        size_t beta = grm().Redge(e).second;
        
        Factor prod = grm().OR(alpha);
        for( RegionGraph::R_nb_cit beta2 = grm().nbOR(alpha).begin(); beta2 != grm().nbOR(alpha).end(); beta2++ )
            if( *beta2 != beta )
                for( RegionGraph::R_nb_cit alpha2 = grm().nbIR(*beta2).begin(); alpha2 != grm().nbIR(*beta2).end(); alpha2++ )
                    if( *alpha2 != alpha )
                        prod *= message(*alpha2, *beta2);
        Factor newmessage = prod.marginal( grm().IR(beta) );

        if( Props.damping == 0.0 )
            message(alpha, beta) = newmessage;
        else
            message(alpha, beta) = (message(alpha,beta) ^ Props.damping) * (newmessage ^ (1.0 - Props.damping));
    }